

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O2

void __thiscall deci_FlexLexer::~deci_FlexLexer(deci_FlexLexer *this)

{
  yy_buffer_state *pyVar1;
  
  (this->super_FlexLexer)._vptr_FlexLexer = (_func_int **)&PTR__deci_FlexLexer_0011dce8;
  if (this->yy_state_buf != (yy_state_type *)0x0) {
    operator_delete__(this->yy_state_buf);
  }
  free(this->yy_start_stack);
  if (this->yy_buffer_stack == (yy_buffer_state **)0x0) {
    pyVar1 = (yy_buffer_state *)0x0;
  }
  else {
    pyVar1 = this->yy_buffer_stack[this->yy_buffer_stack_top];
  }
  (*(this->super_FlexLexer)._vptr_FlexLexer[5])(this,pyVar1);
  free(this->yy_buffer_stack);
  std::ios_base::~ios_base((ios_base *)&this->field_0x150);
  std::istream::~istream(&this->yyin);
  return;
}

Assistant:

yyFlexLexer::~yyFlexLexer()
{
	delete [] yy_state_buf;
	yyfree( yy_start_stack  );
	yy_delete_buffer( YY_CURRENT_BUFFER );
	yyfree( yy_buffer_stack  );
}